

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

void Io_NtkWriteOne(FILE *pFile,Abc_Ntk_t *pNtk,int fWriteLatches,int fBb2Wb,int fSeq)

{
  FILE *pFile_00;
  int iVar1;
  Abc_Obj_t *pAVar2;
  ProgressBar *p;
  int local_64;
  int local_44;
  int Length;
  int i;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pNode;
  ProgressBar *pProgress;
  int fSeq_local;
  int fBb2Wb_local;
  int fWriteLatches_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,".inputs");
  Io_NtkWritePis(pFile,pNtk,fWriteLatches);
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,".outputs");
  Io_NtkWritePos(pFile,pNtk,fWriteLatches);
  fprintf((FILE *)pFile,"\n");
  iVar1 = Abc_NtkHasBlackbox(pNtk);
  if (iVar1 == 0) {
    Io_WriteTimingInfo(pFile,pNtk);
    if ((fWriteLatches != 0) && (iVar1 = Abc_NtkIsComb(pNtk), iVar1 == 0)) {
      fprintf((FILE *)pFile,"\n");
      for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_44 < iVar1;
          local_44 = local_44 + 1) {
        pAVar2 = Abc_NtkBox(pNtk,local_44);
        iVar1 = Abc_ObjIsLatch(pAVar2);
        if (iVar1 != 0) {
          Io_NtkWriteLatch(pFile,pAVar2);
        }
      }
      fprintf((FILE *)pFile,"\n");
    }
    iVar1 = Abc_NtkBlackboxNum(pNtk);
    if ((0 < iVar1) || (iVar1 = Abc_NtkWhiteboxNum(pNtk), 0 < iVar1)) {
      fprintf((FILE *)pFile,"\n");
      for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_44 < iVar1;
          local_44 = local_44 + 1) {
        pAVar2 = Abc_NtkBox(pNtk,local_44);
        iVar1 = Abc_ObjIsBlackbox(pAVar2);
        if (iVar1 != 0) {
          Io_NtkWriteSubckt(pFile,pAVar2);
        }
      }
      fprintf((FILE *)pFile,"\n");
      for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_44 < iVar1;
          local_44 = local_44 + 1) {
        pAVar2 = Abc_NtkBox(pNtk,local_44);
        iVar1 = Abc_ObjIsWhitebox(pAVar2);
        if (iVar1 != 0) {
          Io_NtkWriteSubckt(pFile,pAVar2);
        }
      }
      fprintf((FILE *)pFile,"\n");
    }
    iVar1 = Abc_NtkHasMapping(pNtk);
    if (iVar1 == 0) {
      local_64 = 0;
    }
    else {
      local_64 = Mio_LibraryReadGateNameMax((Mio_Library_t *)pNtk->pManFunc);
    }
    pFile_00 = _stdout;
    iVar1 = Abc_NtkObjNumMax(pNtk);
    p = Extra_ProgressBarStart(pFile_00,iVar1);
    for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_44 < iVar1; local_44 = local_44 + 1)
    {
      pAVar2 = Abc_NtkObj(pNtk,local_44);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
        Extra_ProgressBarUpdate(p,local_44,(char *)0x0);
        iVar1 = Io_NtkWriteNode(pFile,pAVar2,local_64);
        if (iVar1 != 0) {
          local_44 = local_44 + 1;
        }
      }
    }
    Extra_ProgressBarStop(p);
  }
  else if (fBb2Wb == 0) {
    fprintf((FILE *)pFile,".blackbox\n");
  }
  else {
    Io_NtkWriteConvertedBox(pFile,pNtk,fSeq);
  }
  return;
}

Assistant:

void Io_NtkWriteOne( FILE * pFile, Abc_Ntk_t * pNtk, int fWriteLatches, int fBb2Wb, int fSeq )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNode, * pLatch;
    int i, Length;

    // write the PIs
    fprintf( pFile, ".inputs" );
    Io_NtkWritePis( pFile, pNtk, fWriteLatches );
    fprintf( pFile, "\n" );

    // write the POs
    fprintf( pFile, ".outputs" );
    Io_NtkWritePos( pFile, pNtk, fWriteLatches );
    fprintf( pFile, "\n" );

    // write the blackbox
    if ( Abc_NtkHasBlackbox( pNtk ) )
    {
        if ( fBb2Wb )
            Io_NtkWriteConvertedBox( pFile, pNtk, fSeq );
        else
            fprintf( pFile, ".blackbox\n" );
        return;
    }

    // write the timing info
    Io_WriteTimingInfo( pFile, pNtk );

    // write the latches
    if ( fWriteLatches && !Abc_NtkIsComb(pNtk) )
    {
        fprintf( pFile, "\n" );
        Abc_NtkForEachLatch( pNtk, pLatch, i )
            Io_NtkWriteLatch( pFile, pLatch );
        fprintf( pFile, "\n" );
    }

    // write the subcircuits
//    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    if ( Abc_NtkBlackboxNum(pNtk) > 0 || Abc_NtkWhiteboxNum(pNtk) > 0 )
    {
        fprintf( pFile, "\n" );
        Abc_NtkForEachBlackbox( pNtk, pNode, i )
            Io_NtkWriteSubckt( pFile, pNode );
        fprintf( pFile, "\n" );
        Abc_NtkForEachWhitebox( pNtk, pNode, i )
            Io_NtkWriteSubckt( pFile, pNode );
        fprintf( pFile, "\n" );
    }

    // write each internal node
    Length = Abc_NtkHasMapping(pNtk)? Mio_LibraryReadGateNameMax((Mio_Library_t *)pNtk->pManFunc) : 0;
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        if ( Io_NtkWriteNode( pFile, pNode, Length ) ) // skip the next node
            i++;
    }
    Extra_ProgressBarStop( pProgress );
}